

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

reference __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::find_or_insert(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
                 *this,value_type *__obj)

{
  _Node *p_Var1;
  _Node *__cur;
  size_type sVar2;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var3;
  
  resize(this,this->_M_num_elements + 1);
  sVar2 = _M_bkt_num_key(this,&__obj->first);
  p_Var1 = (this->_M_buckets).
           super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar2];
  for (p_Var3 = p_Var1; p_Var3 != (_Node *)0x0; p_Var3 = p_Var3->_M_next) {
    if ((p_Var3->_M_val).first == __obj->first) goto LAB_0011cf60;
  }
  p_Var3 = _M_new_node(this,__obj);
  p_Var3->_M_next = p_Var1;
  (this->_M_buckets).
  super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar2] = p_Var3;
  this->_M_num_elements = this->_M_num_elements + 1;
LAB_0011cf60:
  return &p_Var3->_M_val;
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::reference
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::find_or_insert(const value_type& __obj)
{
  resize(_M_num_elements + 1);

  size_type __n = _M_bkt_num(__obj);
  _Node* __first = _M_buckets[__n];

  for (_Node* __cur = __first; __cur; __cur = __cur->_M_next)
    if (_M_equals(_M_get_key(__cur->_M_val), _M_get_key(__obj)))
      return __cur->_M_val;

  _Node* __tmp = _M_new_node(__obj);
  __tmp->_M_next = __first;
  _M_buckets[__n] = __tmp;
  ++_M_num_elements;
  return __tmp->_M_val;
}